

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_indexed(FuncState *fs,expdesc *t,expdesc *k)

{
  int iVar1;
  lu_byte local_24;
  expdesc *k_local;
  expdesc *t_local;
  FuncState *fs_local;
  
  if (k->k == VKSTR) {
    str2K(fs,k);
  }
  if ((t->k == VUPVAL) && (iVar1 = isKstr(fs,k), iVar1 == 0)) {
    luaK_exp2anyreg(fs,t);
  }
  if (t->k == VUPVAL) {
    (t->u).ind.t = (t->u).var.ridx;
    (t->u).ind.idx = (k->u).ind.idx;
    t->k = VINDEXUP;
  }
  else {
    if (t->k == VLOCAL) {
      local_24 = (t->u).var.ridx;
    }
    else {
      local_24 = (t->u).var.ridx;
    }
    (t->u).ind.t = local_24;
    iVar1 = isKstr(fs,k);
    if (iVar1 == 0) {
      iVar1 = isCint(k);
      if (iVar1 == 0) {
        iVar1 = luaK_exp2anyreg(fs,k);
        (t->u).ind.idx = (short)iVar1;
        t->k = VINDEXED;
      }
      else {
        (t->u).ind.idx = (short)(k->u).ival;
        t->k = VINDEXI;
      }
    }
    else {
      (t->u).ind.idx = (k->u).ind.idx;
      t->k = VINDEXSTR;
    }
  }
  return;
}

Assistant:

void luaK_indexed (FuncState *fs, expdesc *t, expdesc *k) {
  if (k->k == VKSTR)
    str2K(fs, k);
  lua_assert(!hasjumps(t) &&
             (t->k == VLOCAL || t->k == VNONRELOC || t->k == VUPVAL));
  if (t->k == VUPVAL && !isKstr(fs, k))  /* upvalue indexed by non 'Kstr'? */
    luaK_exp2anyreg(fs, t);  /* put it in a register */
  if (t->k == VUPVAL) {
    t->u.ind.t = t->u.info;  /* upvalue index */
    t->u.ind.idx = k->u.info;  /* literal string */
    t->k = VINDEXUP;
  }
  else {
    /* register index of the table */
    t->u.ind.t = (t->k == VLOCAL) ? t->u.var.ridx: t->u.info;
    if (isKstr(fs, k)) {
      t->u.ind.idx = k->u.info;  /* literal string */
      t->k = VINDEXSTR;
    }
    else if (isCint(k)) {
      t->u.ind.idx = cast_int(k->u.ival);  /* int. constant in proper range */
      t->k = VINDEXI;
    }
    else {
      t->u.ind.idx = luaK_exp2anyreg(fs, k);  /* register */
      t->k = VINDEXED;
    }
  }
}